

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_edit_draw_text(nk_command_buffer *out,nk_style_edit *style,float pos_x,float pos_y,
                      float x_offset,char *text,int byte_len,float row_height,nk_user_font *font,
                      nk_color background,nk_color foreground,int is_selected)

{
  nk_rect rect;
  nk_rect b;
  nk_rect rect_00;
  nk_rect b_00;
  float fVar1;
  float fVar2;
  float local_a8;
  nk_rect label_1;
  nk_rect label;
  undefined1 local_80 [8];
  nk_text txt;
  int line_count;
  float line_offset;
  char *line;
  float local_58;
  float glyph_width;
  float line_width;
  int text_len;
  nk_rune unicode;
  int glyph_len;
  nk_user_font *font_local;
  float row_height_local;
  int byte_len_local;
  char *text_local;
  float local_28;
  float x_offset_local;
  float pos_y_local;
  float pos_x_local;
  nk_style_edit *style_local;
  nk_command_buffer *out_local;
  nk_color background_local;
  
  _unicode = font;
  font_local._0_4_ = row_height;
  font_local._4_4_ = byte_len;
  _row_height_local = text;
  text_local._4_4_ = x_offset;
  local_28 = pos_y;
  x_offset_local = pos_x;
  _pos_y_local = style;
  style_local = (nk_style_edit *)out;
  out_local._4_4_ = background;
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5827,
                  "void nk_edit_draw_text(struct nk_command_buffer *, const struct nk_style_edit *, float, float, float, const char *, int, float, const struct nk_user_font *, struct nk_color, struct nk_color, int)"
                 );
  }
  if (font != (nk_user_font *)0x0) {
    if (style != (nk_style_edit *)0x0) {
      if ((((text != (char *)0x0) && (byte_len != 0)) && (out != (nk_command_buffer *)0x0)) &&
         (style != (nk_style_edit *)0x0)) {
        text_len = 0;
        line_width = 0.0;
        glyph_width = 0.0;
        local_58 = 0.0;
        txt.text.r = '\0';
        txt.text.g = '\0';
        txt.text.b = '\0';
        txt.text.a = '\0';
        txt.background.r = '\0';
        txt.background.g = '\0';
        txt.background.b = '\0';
        txt.background.a = '\0';
        local_80 = (undefined1  [8])nk_vec2(0.0,0.0);
        txt.padding.x = (float)out_local._4_4_;
        txt.padding.y = (float)foreground;
        text_len = nk_utf_decode(_row_height_local,(nk_rune *)&line_width,font_local._4_4_);
        _line_count = text;
        if (text_len != 0) {
          while (fVar1 = font_local._0_4_, (int)glyph_width < font_local._4_4_ && text_len != 0) {
            if (line_width == 1.4013e-44) {
              fVar2 = local_28 + (float)txt.text;
              label_1.w = x_offset_local;
              if (txt.background == (nk_color)0x0) {
                label_1.w = text_local._4_4_ + x_offset_local;
              }
              if (is_selected != 0) {
                rect_00.y = fVar2;
                rect_00.x = label_1.w;
                rect_00.w = local_58;
                rect_00.h = font_local._0_4_;
                nk_fill_rect((nk_command_buffer *)style_local,rect_00,0.0,out_local._4_4_);
              }
              b_00.y = fVar2;
              b_00.x = label_1.w;
              b_00.w = local_58;
              b_00.h = fVar1;
              nk_widget_text((nk_command_buffer *)style_local,b_00,_line_count,
                             ((int)row_height_local + (int)glyph_width) - (int)_line_count,
                             (nk_text *)local_80,0x12,_unicode);
              glyph_width = (float)((int)glyph_width + 1);
              txt.background = (nk_color)((int)txt.background + 1);
              local_58 = 0.0;
              _line_count = _row_height_local + (int)glyph_width;
              txt.text = (nk_color)(font_local._0_4_ + (float)txt.text);
              text_len = nk_utf_decode(_row_height_local + (int)glyph_width,(nk_rune *)&line_width,
                                       font_local._4_4_ - (int)glyph_width);
            }
            else if (line_width == 1.82169e-44) {
              glyph_width = (float)((int)glyph_width + 1);
              text_len = nk_utf_decode(_row_height_local + (int)glyph_width,(nk_rune *)&line_width,
                                       font_local._4_4_ - (int)glyph_width);
            }
            else {
              fVar1 = (*_unicode->width)(_unicode->userdata,_unicode->height,
                                         _row_height_local + (int)glyph_width,text_len);
              local_58 = fVar1 + local_58;
              glyph_width = (float)(text_len + (int)glyph_width);
              text_len = nk_utf_decode(_row_height_local + (int)glyph_width,(nk_rune *)&line_width,
                                       font_local._4_4_ - (int)glyph_width);
            }
          }
          if (0.0 < local_58) {
            fVar2 = local_28 + (float)txt.text;
            local_a8 = x_offset_local;
            if (txt.background == (nk_color)0x0) {
              local_a8 = text_local._4_4_ + x_offset_local;
            }
            if (is_selected != 0) {
              rect.y = fVar2;
              rect.x = local_a8;
              rect.w = local_58;
              rect.h = font_local._0_4_;
              nk_fill_rect((nk_command_buffer *)style_local,rect,0.0,out_local._4_4_);
            }
            b.y = fVar2;
            b.x = local_a8;
            b.w = local_58;
            b.h = fVar1;
            nk_widget_text((nk_command_buffer *)style_local,b,_line_count,
                           ((int)row_height_local + (int)glyph_width) - (int)_line_count,
                           (nk_text *)local_80,0x11,_unicode);
          }
        }
      }
      return;
    }
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x5829,
                  "void nk_edit_draw_text(struct nk_command_buffer *, const struct nk_style_edit *, float, float, float, const char *, int, float, const struct nk_user_font *, struct nk_color, struct nk_color, int)"
                 );
  }
  __assert_fail("font",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x5828,
                "void nk_edit_draw_text(struct nk_command_buffer *, const struct nk_style_edit *, float, float, float, const char *, int, float, const struct nk_user_font *, struct nk_color, struct nk_color, int)"
               );
}

Assistant:

NK_LIB void
nk_edit_draw_text(struct nk_command_buffer *out,
    const struct nk_style_edit *style, float pos_x, float pos_y,
    float x_offset, const char *text, int byte_len, float row_height,
    const struct nk_user_font *font, struct nk_color background,
    struct nk_color foreground, int is_selected)
{
    NK_ASSERT(out);
    NK_ASSERT(font);
    NK_ASSERT(style);
    if (!text || !byte_len || !out || !style) return;

    {int glyph_len = 0;
    nk_rune unicode = 0;
    int text_len = 0;
    float line_width = 0;
    float glyph_width;
    const char *line = text;
    float line_offset = 0;
    int line_count = 0;

    struct nk_text txt;
    txt.padding = nk_vec2(0,0);
    txt.background = background;
    txt.text = foreground;

    glyph_len = nk_utf_decode(text+text_len, &unicode, byte_len-text_len);
    if (!glyph_len) return;
    while ((text_len < byte_len) && glyph_len)
    {
        if (unicode == '\n') {
            /* new line separator so draw previous line */
            struct nk_rect label;
            label.y = pos_y + line_offset;
            label.h = row_height;
            label.w = line_width;
            label.x = pos_x;
            if (!line_count)
                label.x += x_offset;

            if (is_selected) /* selection needs to draw different background color */
                nk_fill_rect(out, label, 0, background);
            nk_widget_text(out, label, line, (int)((text + text_len) - line),
                &txt, NK_TEXT_CENTERED, font);

            text_len++;
            line_count++;
            line_width = 0;
            line = text + text_len;
            line_offset += row_height;
            glyph_len = nk_utf_decode(text + text_len, &unicode, (int)(byte_len-text_len));
            continue;
        }
        if (unicode == '\r') {
            text_len++;
            glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
            continue;
        }
        glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
        line_width += (float)glyph_width;
        text_len += glyph_len;
        glyph_len = nk_utf_decode(text + text_len, &unicode, byte_len-text_len);
        continue;
    }
    if (line_width > 0) {
        /* draw last line */
        struct nk_rect label;
        label.y = pos_y + line_offset;
        label.h = row_height;
        label.w = line_width;
        label.x = pos_x;
        if (!line_count)
            label.x += x_offset;

        if (is_selected)
            nk_fill_rect(out, label, 0, background);
        nk_widget_text(out, label, line, (int)((text + text_len) - line),
            &txt, NK_TEXT_LEFT, font);
    }}
}